

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kiste2cpp.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  byte bVar3;
  ulong uVar4;
  ostream *poVar5;
  size_t __n;
  parse_error *e;
  vector<kiste::line_t,_std::allocator<kiste::line_t>_> lines;
  parse_context ctx;
  ofstream ofs;
  ostream *local_390;
  ostream *os;
  ifstream ifs;
  allocator<char> local_179;
  string local_178;
  allocator<char> local_151;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  allocator<char> local_109;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  allocator<char> local_e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  undefined4 local_c0;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  int local_60;
  byte local_5a;
  byte local_59;
  int i;
  bool line_directives;
  bool report_exceptions;
  string output_file_path;
  string source_file_path;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  std::__cxx11::string::string((string *)(output_file_path.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&i);
  local_59 = 0;
  local_5a = 1;
  for (local_60 = 1; local_60 < argc; local_60 = local_60 + 1) {
    pcVar1 = argv[local_60];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,pcVar1,&local_81);
    bVar2 = std::operator==(&local_80,"--output");
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator(&local_81);
    if (bVar2) {
      if ((argc <= local_60 + 1) || (uVar4 = std::__cxx11::string::empty(), (uVar4 & 1) == 0)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b8,"No output file given, or given twice",&local_b9);
        argv_local._4_4_ = usage(&local_b8);
        std::__cxx11::string::~string((string *)&local_b8);
        std::allocator<char>::~allocator(&local_b9);
        local_c0 = 1;
        goto LAB_0010c0cf;
      }
      std::__cxx11::string::operator=((string *)&i,argv[(long)local_60 + 1]);
      local_60 = local_60 + 1;
    }
    else {
      pcVar1 = argv[local_60];
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,pcVar1,&local_e1);
      bVar2 = std::operator==(&local_e0,"--report-exceptions");
      std::__cxx11::string::~string((string *)&local_e0);
      std::allocator<char>::~allocator(&local_e1);
      if (bVar2) {
        local_59 = 1;
      }
      else {
        pcVar1 = argv[local_60];
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,pcVar1,&local_109);
        bVar2 = std::operator==(&local_108,"--no-line-directives");
        std::__cxx11::string::~string((string *)&local_108);
        std::allocator<char>::~allocator(&local_109);
        if (bVar2) {
          local_5a = 0;
        }
        else {
          uVar4 = std::__cxx11::string::empty();
          if ((uVar4 & 1) == 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_150,"Extra argument: ",&local_151);
            std::operator+(&local_130,&local_150,argv[local_60]);
            argv_local._4_4_ = usage(&local_130);
            std::__cxx11::string::~string((string *)&local_130);
            std::__cxx11::string::~string((string *)&local_150);
            std::allocator<char>::~allocator(&local_151);
            local_c0 = 1;
            goto LAB_0010c0cf;
          }
          std::__cxx11::string::operator=
                    ((string *)(output_file_path.field_2._M_local_buf + 8),argv[local_60]);
        }
      }
    }
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_178,"No input file given",&local_179);
    argv_local._4_4_ = usage(&local_178);
    std::__cxx11::string::~string((string *)&local_178);
    std::allocator<char>::~allocator(&local_179);
    local_c0 = 1;
    goto LAB_0010c0cf;
  }
  std::ifstream::ifstream(&os,(string *)(output_file_path.field_2._M_local_buf + 8),_S_in);
  bVar3 = std::ios::operator!((ios *)((long)&os + *(long *)(os + -0x18)));
  if ((bVar3 & 1) == 0) {
    local_390 = (ostream *)&std::cout;
    std::ofstream::ofstream(&ctx._has_trailing_return);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      std::ofstream::open((string *)&ctx._has_trailing_return,(_Ios_Openmode)&i);
      bVar3 = std::ios::operator!((ios *)(&ctx._has_trailing_return + *(long *)(ctx._112_8_ + -0x18)
                                         ));
      if ((bVar3 & 1) == 0) {
        local_390 = (ostream *)&ctx._has_trailing_return;
        goto LAB_0010be53;
      }
      poVar5 = std::operator<<((ostream *)&std::cerr,"Could not open output file ");
      poVar5 = std::operator<<(poVar5,(string *)&i);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      argv_local._4_4_ = 1;
      local_c0 = 1;
    }
    else {
LAB_0010be53:
      kiste::parse_context::parse_context
                ((parse_context *)
                 &lines.super__Vector_base<kiste::line_t,_std::allocator<kiste::line_t>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(istream *)&os,local_390,
                 (string *)((long)&output_file_path.field_2 + 8),(bool)(local_59 & 1),
                 (bool)(local_5a & 1));
      kiste::parse((vector<kiste::line_t,_std::allocator<kiste::line_t>_> *)&e,
                   (parse_context *)
                   &lines.super__Vector_base<kiste::line_t,_std::allocator<kiste::line_t>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
      kiste::write((int)&lines + 0x10,&e,__n);
      std::vector<kiste::line_t,_std::allocator<kiste::line_t>_>::~vector
                ((vector<kiste::line_t,_std::allocator<kiste::line_t>_> *)&e);
      local_c0 = 0;
      kiste::parse_context::~parse_context
                ((parse_context *)
                 &lines.super__Vector_base<kiste::line_t,_std::allocator<kiste::line_t>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    }
    std::ofstream::~ofstream(&ctx._has_trailing_return);
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Could not open ");
    poVar5 = std::operator<<(poVar5,(string *)(output_file_path.field_2._M_local_buf + 8));
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = 1;
    local_c0 = 1;
  }
  std::ifstream::~ifstream(&os);
LAB_0010c0cf:
  std::__cxx11::string::~string((string *)&i);
  std::__cxx11::string::~string((string *)(output_file_path.field_2._M_local_buf + 8));
  return argv_local._4_4_;
}

Assistant:

auto main(int argc, char** argv) -> int
{
  auto source_file_path = std::string{};
  auto output_file_path = std::string{};
  auto report_exceptions = false;
  auto line_directives = true;

  for (int i = 1; i < argc; ++i)
  {
    if (std::string{argv[i]} == "--output")
    {
      if (i + 1 < argc and output_file_path.empty())
      {
        output_file_path = argv[i + 1];
        ++i;
      }
      else
      {
        return usage("No output file given, or given twice");
      }
    }
    else if (std::string{argv[i]} == "--report-exceptions")
    {
      report_exceptions = true;
    }
    else if (std::string{argv[i]} == "--no-line-directives")
    {
      line_directives = false;
    }
    else if (source_file_path.empty())
    {
      source_file_path = argv[i];
    }
    else
    {
      return usage(std::string{"Extra argument: "} + argv[i]);
    }
  }

  if (source_file_path.empty())
    return usage("No input file given");

  std::ifstream ifs{source_file_path};
  if (not ifs)
  {
    std::cerr << "Could not open " << source_file_path << std::endl;
    return 1;
  }

  std::ostream* os = &std::cout;
  std::ofstream ofs;
  if (not output_file_path.empty())
  {
    ofs.open(output_file_path, std::ios::out);
    if (not ofs)
    {
      std::cerr << "Could not open output file " << output_file_path << std::endl;
      return 1;
    }

    os = &ofs;
  }

  auto ctx = kiste::parse_context{ifs, *os, source_file_path, report_exceptions, line_directives};

  try
  {
    const auto lines = kiste::parse(ctx);
    kiste::write(ctx, lines);
  }
  catch (const kiste::parse_error& e)
  {
    std::cerr << "Parse error in file: " << ctx._filename << std::endl;
    std::cerr << "Line number: " << ctx._line_no << std::endl;
    std::cerr << "Message: " << e.what() << std::endl;
    std::cerr << "Line: " << ctx._line << std::endl;
    return 1;
  }
}